

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O3

bool booster::operator>(string_type *l,sub_match<const_char_*> *r)

{
  int iVar1;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  if (r->matched == true) {
    local_28 = local_18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_28,(r->super_pair<const_char_*,_const_char_*>).first,
               (r->super_pair<const_char_*,_const_char_*>).second);
  }
  else {
    local_28 = local_18;
    local_20 = 0;
    local_18[0] = 0;
  }
  iVar1 = std::__cxx11::string::compare((string *)l);
  if (local_28 != local_18) {
    operator_delete(local_28);
  }
  return 0 < iVar1;
}

Assistant:

bool operator>(
		typename sub_match<Iterator>::string_type const &l,
		sub_match<Iterator> const &r) 
	{ return l.compare(r) > 0; }